

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O0

int cuddAnnealing(DdManager *table,int lower,int upper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *array;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int tmp;
  int dcount;
  int ucount;
  int ecount;
  int maxGen;
  int innerloop;
  double rand1;
  double temp;
  double NewTemp;
  int *BestOrder;
  int BestCost;
  int c4;
  int c3;
  int c2;
  int c1;
  int result;
  int y;
  int x;
  int size;
  int nvars;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  iVar1 = (upper - lower) + 1;
  iVar2 = cuddSifting(table,lower,upper);
  if (iVar2 == 0) {
    table_local._4_4_ = 0;
  }
  else {
    BestOrder._0_4_ = table->keys - table->isolated;
    array = (int *)malloc((long)iVar1 << 2);
    if (array == (int *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
      table_local._4_4_ = 0;
    }
    else {
      copyOrder(table,array,lower,upper);
      ucount = (int)((double)iVar1 * 15.0);
      c3 = (int)BestOrder + 10;
      c4 = (int)BestOrder + 0x14;
      BestOrder._4_4_ = (int)BestOrder + 0x1e;
      dVar5 = (double)(int)BestOrder * 0.6;
      BestCost = (int)BestOrder;
      y = (int)BestOrder;
      while (rand1 = dVar5, iVar2 = stopping_criterion(c3,c4,BestCost,BestOrder._4_4_,rand1),
            iVar2 == 0) {
        for (ecount = 0; ecount < ucount; ecount = ecount + 1) {
          uVar4 = Cudd_Random();
          iVar2 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                       (long)iVar1);
          do {
            uVar4 = Cudd_Random();
            iVar3 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                         (long)iVar1);
          } while (iVar2 == iVar3);
          result = lower + iVar2;
          iVar3 = lower + iVar3;
          c1 = iVar3;
          if (iVar3 < result) {
            c1 = result;
            result = iVar3;
          }
          dVar5 = random_generator();
          if (0.4 <= dVar5) {
            if (0.76 <= dVar5) {
              c2 = ddJumpingAux(table,result,result,c1,rand1);
            }
            else {
              c2 = ddJumpingAux(table,c1,result,c1,rand1);
            }
          }
          else {
            c2 = ddExchange(table,result,c1,rand1);
          }
          if (c2 == 0) {
            if (array != (int *)0x0) {
              free(array);
            }
            return 0;
          }
          y = table->keys - table->isolated;
          if (y < (int)BestOrder) {
            copyOrder(table,array,lower,upper);
            BestOrder._0_4_ = y;
          }
        }
        c3 = c4;
        c4 = BestCost;
        BestCost = BestOrder._4_4_;
        BestOrder._4_4_ = y;
        dVar5 = rand1 * 0.9;
        if (1.0 <= dVar5) {
          dVar6 = log(dVar5);
          dVar7 = log(rand1);
          ucount = (int)((dVar6 / dVar7) * (double)ucount);
        }
      }
      iVar1 = restoreOrder(table,array,lower,upper);
      if (array != (int *)0x0) {
        free(array);
      }
      if (iVar1 == 0) {
        table_local._4_4_ = 0;
      }
      else {
        table_local._4_4_ = 1;
      }
    }
  }
  return table_local._4_4_;
}

Assistant:

int
cuddAnnealing(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         nvars;
    int         size;
    int         x,y;
    int         result;
    int         c1, c2, c3, c4;
    int         BestCost;
    int         *BestOrder;
    double      NewTemp, temp;
    double      rand1;
    int         innerloop, maxGen;
    int         ecount, ucount, dcount;
   
    nvars = upper - lower + 1;

    result = cuddSifting(table,lower,upper);
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    if (result == 0) return(0);

    size = table->keys - table->isolated;

    /* Keep track of the best order. */
    BestCost = size;
    BestOrder = ABC_ALLOC(int,nvars);
    if (BestOrder == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    copyOrder(table,BestOrder,lower,upper);

    temp = BETA * size;
    maxGen = (int) (MAXGEN_RATIO * nvars);

    c1 = size + 10;
    c2 = c1 + 10;
    c3 = size;
    c4 = c2 + 10;
    ecount = ucount = dcount = 0;
 
    while (!stopping_criterion(c1, c2, c3, c4, temp)) {
#ifdef DD_STATS
        (void) fprintf(table->out,"temp=%f\tsize=%d\tgen=%d\t",
                       temp,size,maxGen);
        tosses = acceptances = 0;
#endif
        for (innerloop = 0; innerloop < maxGen; innerloop++) {
            /* Choose x, y  randomly. */
            x = (int) Cudd_Random() % nvars;
            do {
                y = (int) Cudd_Random() % nvars;
            } while (x == y);
            x += lower;
            y += lower;
            if (x > y) {
                int tmp = x;
                x = y;
                y = tmp;
            }

            /* Choose move with roulette wheel. */
            rand1 = random_generator();
            if (rand1 < EXC_PROB) {
                result = ddExchange(table,x,y,temp);       /* exchange */
                ecount++;
#if 0
                (void) fprintf(table->out,
                               "Exchange of %d and %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            } else if (rand1 < EXC_PROB + JUMP_UP_PROB) {
                result = ddJumpingAux(table,y,x,y,temp); /* jumping_up */
                ucount++;
#if 0
                (void) fprintf(table->out,
                               "Jump up of %d to %d: size = %d\n",
                               y,x,table->keys - table->isolated);
#endif
            } else {
                result = ddJumpingAux(table,x,x,y,temp); /* jumping_down */
                dcount++;
#if 0
                (void) fprintf(table->out,
                               "Jump down of %d to %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            }

            if (!result) {
                ABC_FREE(BestOrder);
                return(0);
            }

            size = table->keys - table->isolated;       /* keep current size */
            if (size < BestCost) {                      /* update best order */
                BestCost = size;
                copyOrder(table,BestOrder,lower,upper);
            }
        }
        c1 = c2;
        c2 = c3;
        c3 = c4;
        c4 = size;
        NewTemp = ALPHA * temp;
        if (NewTemp >= 1.0) {
            maxGen = (int)(log(NewTemp) / log(temp) * maxGen);
        }
        temp = NewTemp;                 /* control variable */
#ifdef DD_STATS
        (void) fprintf(table->out,"uphill = %d\taccepted = %d\n",
                       tosses,acceptances);
        fflush(table->out);
#endif
    }

    result = restoreOrder(table,BestOrder,lower,upper);
    ABC_FREE(BestOrder);
    if (!result) return(0);
#ifdef DD_STATS
    fprintf(table->out,"#:N_EXCHANGE %8d : total exchanges\n",ecount);
    fprintf(table->out,"#:N_JUMPUP   %8d : total jumps up\n",ucount);
    fprintf(table->out,"#:N_JUMPDOWN %8d : total jumps down",dcount);
#endif
    return(1);

}